

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex-test.c++
# Opt level: O2

void __thiscall kj::anon_unknown_0::TestCase395::run(TestCase395 *this)

{
  Quantity<long,_kj::_::NanosecondLabel> QVar1;
  MonotonicClock *pMVar2;
  long lVar3;
  long lVar4;
  int iVar5;
  Quantity<long,_kj::_::NanosecondLabel> t;
  PredicateImpl impl;
  anon_class_8_1_a8c68091 local_68;
  Mutex *local_60;
  Maybe<kj::_::Mutex::Waiter_&> local_58;
  MutexGuarded<unsigned_int> value;
  
  iVar5 = 0x15;
  pMVar2 = systemPreciseMonotonicClock();
  do {
    iVar5 = iVar5 + -1;
    if (iVar5 == 0) {
      _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[51]>
                ((Fault *)&impl,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/mutex-test.c++"
                 ,0x1a7,FAILED,(char *)0x0,"\"time not within expected bounds even after retries\"",
                 (char (*) [51])"time not within expected bounds even after retries");
      _::Debug::Fault::fatal((Fault *)&impl);
    }
    _::Mutex::Mutex(&value.mutex);
    value.value = 0x7b;
    lVar3 = (*(code *)**(undefined8 **)pMVar2)(pMVar2);
    local_68.value = &value;
    MutexGuarded<unsigned_int>::lockExclusive((MutexGuarded<unsigned_int> *)&local_60,&value);
    impl.super_Predicate._vptr_Predicate = (_func_int **)&PTR_check_0021d538;
    impl.condition = &local_68;
    impl.value = (uint *)local_58.ptr;
    t.value._0_1_ = 1;
    _::Mutex::wait(local_60,&impl);
    Locked<unsigned_int>::~Locked((Locked<unsigned_int> *)&local_60);
    lVar4 = (*(code *)**(undefined8 **)pMVar2)(pMVar2);
    t.value = lVar4 - lVar3;
    impl.super_Predicate._vptr_Predicate = (_func_int **)&t;
    impl.condition = (anon_class_8_1_a8c68091 *)0x5f5e100;
    impl.value = (uint *)anon_var_dwarf_1dba4d;
    if ((t.value < 100000000) && (_::Debug::minSeverity < 3)) {
      _::Debug::
      log<char_const(&)[45],kj::_::DebugComparison<kj::Quantity<long,kj::_::NanosecondLabel>&,kj::Quantity<long,kj::_::NanosecondLabel>>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/mutex-test.c++"
                 ,0x1a0,ERROR,"\"failed: expected \" \"t >= 100 * kj::MILLISECONDS\", _kjCondition",
                 (char (*) [45])"failed: expected t >= 100 * kj::MILLISECONDS",
                 (DebugComparison<kj::Quantity<long,_kj::_::NanosecondLabel>_&,_kj::Quantity<long,_kj::_::NanosecondLabel>_>
                  *)&impl);
    }
    QVar1.value = t.value;
    _::Mutex::~Mutex(&value.mutex);
  } while (120000000 < QVar1.value);
  return;
}

Assistant:

TEST(Mutex, WhenWithTimeoutPreciseTiming) {
  // Test that MutexGuarded::when() with a timeout sleeps for precisely the right amount of time.

  auto& clock = systemPreciseMonotonicClock();

  for (uint retryCount = 0; retryCount < 20; retryCount++) {
    MutexGuarded<uint> value(123);

    auto start = clock.now();
    uint m = value.when([&value](uint n) {
      // HACK: Reset the value as a way of testing what happens when the waiting thread is woken
      //   up but then finds it's not ready yet.
      value.getWithoutLock() = 123;
      return n == 321;
    }, [](uint& n) {
      return 456;
    }, 100 * kj::MILLISECONDS);

    KJ_EXPECT(m == 456);

    auto t = clock.now() - start;
    KJ_EXPECT(t >= 100 * kj::MILLISECONDS);
    // Provide a large margin of error here because some operating systems (e.g. Windows) can have
    // long timeslices (13ms) and won't schedule more precisely than a timeslice.
    if (t <= 120 * kj::MILLISECONDS) {
      return;
    }
  }
  KJ_FAIL_ASSERT("time not within expected bounds even after retries");
}